

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

void fs_event_create_files(uv_timer_t *handle)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int64_t eval_b;
  int64_t eval_a;
  
  eval_a = (int64_t)fs_event_created;
  eval_b = 0x10;
  if (0xf < eval_a) {
    pcVar5 = "<";
    pcVar6 = "fs_event_file_count";
    pcVar4 = "fs_event_created";
    uVar3 = 0x99;
LAB_0011f586:
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,uVar3,pcVar4,pcVar5,pcVar6,eval_a,pcVar5,eval_b);
    abort();
  }
  fs_event_get_filename(fs_event_created);
  create_file(fs_event_filename);
  iVar2 = fs_event_created + 1;
  bVar1 = fs_event_created < 0xf;
  fs_event_created = iVar2;
  if (bVar1) {
    iVar2 = uv_timer_start(&timer,fs_event_create_files,100,0);
    eval_a = (int64_t)iVar2;
    eval_b = 0;
    if (eval_a != 0) {
      pcVar5 = "==";
      pcVar6 = "0";
      pcVar4 = "uv_timer_start(&timer, fs_event_create_files, 100, 0)";
      uVar3 = 0xa1;
      goto LAB_0011f586;
    }
  }
  return;
}

Assistant:

static void fs_event_create_files(uv_timer_t* handle) {
  /* Make sure we're not attempting to create files we do not intend */
  ASSERT_LT(fs_event_created, fs_event_file_count);

  /* Create the file */
  create_file(fs_event_get_filename(fs_event_created));

  if (++fs_event_created < fs_event_file_count) {
    /* Create another file on a different event loop tick.  We do it this way
     * to avoid fs events coalescing into one fs event. */
    ASSERT_OK(uv_timer_start(&timer, fs_event_create_files, 100, 0));
  }
}